

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O3

void steal_monster_item(monster_conflict *mon,wchar_t midx)

{
  uint32_t *puVar1;
  byte bVar2;
  wchar_t wVar3;
  int16_t *piVar4;
  loc grid;
  player *ppVar5;
  _Bool _Var6;
  int16_t iVar7;
  int iVar8;
  uint32_t uVar9;
  object *obj_00;
  monster_lore *pmVar10;
  monster_conflict *mon_00;
  uint32_t uVar11;
  int iVar12;
  source sVar13;
  source origin;
  source origin_00;
  object *obj;
  monster_lore *local_e0;
  char t_name [80];
  char m_name [80];
  
  obj_00 = get_random_monster_object(mon);
  obj = obj_00;
  pmVar10 = get_lore(mon->race);
  monster_desc(m_name,0x50,(monster *)mon,L'\x15');
  if (midx < L'\0') {
    _Var6 = monster_is_unique((monster *)mon);
    iVar8 = (_Var6 + 3) * mon->race->level;
    iVar12 = iVar8 + 3;
    if (-1 < iVar8) {
      iVar12 = iVar8;
    }
    if (obj_00 != (object *)0x0) {
      uVar9 = ((uint)mon->mspeed + (iVar12 >> 2)) - (player->state).speed;
      piVar4 = player->timed;
      iVar12 = adj_dex_th[(player->state).stat_ind[3]] + (player->state).skills[5];
      if (((piVar4[2] != 0) || (piVar4[4] != 0)) || (piVar4[6] != 0)) {
        iVar8 = iVar12 + 3;
        if (-1 < iVar12) {
          iVar8 = iVar12;
        }
        iVar12 = iVar8 >> 2;
      }
      uVar11 = (int)uVar9 / 2;
      if (mon->m_timed[0] == 0) {
        uVar11 = uVar9;
      }
      uVar9 = 1;
      if (1 < (int)uVar11) {
        uVar9 = uVar11;
      }
      local_e0 = pmVar10;
      uVar9 = Rand_div(uVar9);
      bVar2 = obj_00->number;
      iVar7 = object_weight_one(obj_00);
      iVar8 = (int)((int)iVar7 * (uint)bVar2) / 0x14 + uVar9 + (int)uVar11 / 2 + 1;
      if (iVar8 < iVar12) {
        wVar3 = (player->state).skills[5];
        obj_00->held_m_idx = 0;
        pile_excise(&mon->held_obj,obj_00);
        _Var6 = tval_is_money(obj_00);
        if (_Var6) {
          msg("You steal %d gold pieces worth of treasure.",(ulong)(uint)(int)obj_00->pval);
          ppVar5 = player;
          player->au = player->au + (int)obj->pval;
          puVar1 = &ppVar5->upkeep->redraw;
          *puVar1 = *puVar1 | 0x100;
          delist_object(cave,obj);
          object_delete((chunk *)cave,(chunk *)player->cave,&obj);
          pmVar10 = local_e0;
        }
        else {
          object_grab(player,obj_00);
          delist_object((chunk_conflict *)player->cave,obj->known);
          delist_object(cave,obj);
          _Var6 = ignore_item_ok(player,obj);
          pmVar10 = local_e0;
          if ((_Var6) || (_Var6 = inven_carry_okay(obj), !_Var6)) {
            object_desc(t_name,0x50,obj,0x43,player);
            grid.x = (player->grid).x;
            grid.y = (player->grid).y;
            drop_near((chunk *)cave,&obj,L'\0',grid,true,true);
            msg("You drop %s.");
          }
          else {
            inven_carry(player,obj,true,true);
          }
        }
        pmVar10->thefts = pmVar10->thefts + 1;
        mon_dec_timed((monster *)mon,L'\0',L'#' - wVar3,L'\x01');
      }
      else if (iVar8 / 2 < iVar12) {
        object_see(player,obj_00);
        _Var6 = tval_is_money(obj_00);
        if (_Var6) {
          strnfmt(t_name,0x50,"treasure");
        }
        else {
          object_desc(t_name,0x50,obj_00,0x43,player);
        }
        msg("You fail to steal %s from %s.",t_name,m_name);
        monster_wake(mon,true,L'2');
      }
      else {
        monster_wake(mon,true,L'd');
        monster_desc(m_name,0x50,(monster *)mon,L'̔');
        msg("%s cries out in anger!",m_name);
        sVar13 = source_monster(mon->midx);
        origin.which = sVar13.which;
        origin._4_4_ = 0;
        origin.what = sVar13.what;
        effect_simple(L'6',origin,"",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
        (mon->target).midx = L'\xffffffff';
      }
      if (player->timed[0x2d] != 0) {
        msg("You vanish into the shadows!");
        sVar13 = source_player();
        origin_00.which = sVar13.which;
        origin_00._4_4_ = 0;
        origin_00.what = sVar13.what;
        effect_simple(L';',origin_00,"20",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
        player_clear_timed(player,L'-',false,false);
      }
      return;
    }
    msg("You can find nothing to steal from %s.");
    uVar9 = Rand_div(3);
    if (uVar9 != 0) {
      return;
    }
    monster_wake(mon,false,L'd');
    return;
  }
  mon_00 = (monster_conflict *)cave_monster(cave,midx);
  if (mon_00 == (monster_conflict *)0x0) {
    __assert_fail("thief",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                  ,0x648,"void steal_monster_item(struct monster *, int)");
  }
  monster_desc(t_name,0x50,(monster *)mon_00,L'̔');
  if ((obj_00 != (object *)0x0) && (_Var6 = react_to_slay(obj_00,mon_00), !_Var6)) {
    msg("%s steals something from %s!",t_name,m_name);
    obj_00->held_m_idx = 0;
    pile_excise(&mon->held_obj,obj_00);
    monster_carry((chunk *)cave,mon_00,obj_00);
    (mon->target).midx = mon_00->midx;
    return;
  }
  msg("%s tries to steal something from %s, but fails.",t_name,m_name);
  return;
}

Assistant:

void steal_monster_item(struct monster *mon, int midx)
{
	struct object *obj = get_random_monster_object(mon);
	struct monster_lore *lore = get_lore(mon->race);
	struct monster *thief = NULL;
	char m_name[80];

	/* Get the target monster name (or "it") */
	monster_desc(m_name, sizeof(m_name), mon, MDESC_TARG);

	if (midx < 0) {
		/* Base monster protection and player stealing skill */
		bool unique = monster_is_unique(mon);
		int guard = (mon->race->level * (unique ? 4 : 3)) / 4 +
			mon->mspeed - player->state.speed;
		int steal_skill = player->state.skills[SKILL_STEALTH] +
			adj_dex_th[player->state.stat_ind[STAT_DEX]];
		int monster_reaction;

		/* No object */
		if (!obj) {
			msg("You can find nothing to steal from %s.", m_name);
			if (one_in_(3)) {
				/* Monster notices */
				monster_wake(mon, false, 100);
			}
			return;
		}

		/* Penalize some status conditions */
		if (player->timed[TMD_BLIND] || player->timed[TMD_CONFUSED] ||
			player->timed[TMD_IMAGE]) {
			steal_skill /= 4;
		}
		if (mon->m_timed[MON_TMD_SLEEP]) {
			guard /= 2;
		}

		/* Monster base reaction, plus allowance for item weight */
		monster_reaction = guard / 2 + randint1(MAX(guard, 1));
		monster_reaction += (obj->number * object_weight_one(obj)) / 20;

		/* Try and steal */
		if (monster_reaction < steal_skill) {
			int wake = 35 - player->state.skills[SKILL_STEALTH];

			/* Success! */
			obj->held_m_idx = 0;
			pile_excise(&mon->held_obj, obj);
			if (tval_is_money(obj)) {
				msg("You steal %d gold pieces worth of treasure.", obj->pval);
				player->au += obj->pval;
				player->upkeep->redraw |= (PR_GOLD);
				delist_object(cave, obj);
				object_delete(cave, player->cave, &obj);
			} else {
				object_grab(player, obj);
				delist_object(player->cave, obj->known);
				delist_object(cave, obj);
				/* Drop immediately if ignored,
				   or if inventory already full to prevent pack overflow */
				if (ignore_item_ok(player, obj) || !inven_carry_okay(obj)) {
					char o_name[80];
					object_desc(o_name, sizeof(o_name), obj,
						ODESC_PREFIX | ODESC_FULL,
						player);
					drop_near(cave, &obj, 0, player->grid, true, true);
					msg("You drop %s.", o_name);
				} else {
					inven_carry(player, obj, true, true);
				}
			}

			/* Track thefts */
			lore->thefts++;

			/* Monster wakes a little */
			mon_dec_timed(mon, MON_TMD_SLEEP, wake, MON_TMD_FLG_NOTIFY);
		} else if (monster_reaction / 2 < steal_skill) {
			/* Decent attempt, at least */
			char o_name[80];

			object_see(player, obj);
			if (tval_is_money(obj)) {
				(void)strnfmt(o_name, sizeof(o_name), "treasure");
			} else {
				object_desc(o_name, sizeof(o_name), obj,
					ODESC_PREFIX | ODESC_FULL, player);
			}
			msg("You fail to steal %s from %s.", o_name, m_name);
			/* Monster wakes, may notice */
			monster_wake(mon, true, 50);
		} else {
			/* Bungled it */
			monster_wake(mon, true, 100);
			monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
			msg("%s cries out in anger!", m_name);
			effect_simple(EF_WAKE, source_monster(mon->midx), "", 0, 0, 0, 0, 0,
						  NULL);

			/* Become hostile */
			mon->target.midx = -1;
		}

		/* Player hit and run */
		if (player->timed[TMD_ATT_RUN]) {
			const char *near = "20";
			msg("You vanish into the shadows!");
			effect_simple(EF_TELEPORT, source_player(), near, 0, 0, 0, 0, 0,
						  NULL);
			(void) player_clear_timed(player, TMD_ATT_RUN, false,
				false);
		}
	} else {
		/* Get the thief details */
		char t_name[80];
		thief = cave_monster(cave, midx);
		assert(thief);
		monster_desc(t_name, sizeof(t_name), thief, MDESC_STANDARD);

		/* Try to steal */
		if (!obj || react_to_slay(obj, thief)) {
			/* Fail to steal */
			msg("%s tries to steal something from %s, but fails.", t_name,
				m_name);
		} else {
			msg("%s steals something from %s!", t_name, m_name);

			/* Steal and carry */
			obj->held_m_idx = 0;
			pile_excise(&mon->held_obj, obj);
			(void)monster_carry(cave, thief, obj);

			/* Become hostile */
			mon->target.midx = thief->midx;
		}
	}
}